

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O2

void __thiscall wasm::PoppifyPass::run(PoppifyPass *this,Module *module)

{
  undefined1 local_118 [8];
  PassRunner subRunner;
  _Head_base<0UL,_wasm::Pass_*,_false> local_20;
  
  PassRunner::PassRunner((PassRunner *)local_118,(this->super_Pass).runner);
  std::make_unique<wasm::(anonymous_namespace)::PoppifyFunctionsPass>();
  local_20._M_head_impl = (Pass *)subRunner._232_8_;
  PassRunner::add((PassRunner *)local_118,
                  (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_20);
  if (local_20._M_head_impl != (Pass *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Pass[1])();
  }
  local_20._M_head_impl = (Pass *)0x0;
  PassRunner::run((PassRunner *)local_118);
  lowerTupleGlobals(this,module);
  PassRunner::~PassRunner((PassRunner *)local_118);
  return;
}

Assistant:

void run(Module* module) {
    PassRunner subRunner(getPassRunner());
    subRunner.add(std::make_unique<PoppifyFunctionsPass>());
    // TODO: Enable this once it handles Poppy blocks correctly
    // subRunner.add(std::make_unique<ReFinalize>());
    subRunner.run();
    lowerTupleGlobals(module);
  }